

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_build_grayscale_palette(int bit_depth,png_colorp palette)

{
  long lVar1;
  png_byte pVar2;
  char cVar3;
  png_byte *ppVar4;
  uint uVar5;
  bool bVar6;
  
  if (palette != (png_colorp)0x0) {
    uVar5 = bit_depth - 1;
    if (uVar5 < 8) {
      lVar1 = *(long *)(&DAT_0012b460 + (ulong)uVar5 * 8);
      cVar3 = (char)(0x1000000110055ff >> ((char)uVar5 * '\b' & 0x3fU));
    }
    else {
      lVar1 = 0;
      cVar3 = '\0';
    }
    ppVar4 = &palette->blue;
    pVar2 = '\0';
    while (bVar6 = lVar1 != 0, lVar1 = lVar1 + -1, bVar6) {
      ((png_color *)(ppVar4 + -2))->red = pVar2;
      ppVar4[-1] = pVar2;
      *ppVar4 = pVar2;
      pVar2 = pVar2 + cVar3;
      ppVar4 = ppVar4 + 3;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_build_grayscale_palette(int bit_depth, png_colorp palette)
{
   int num_palette;
   int color_inc;
   int i;
   int v;

   png_debug(1, "in png_do_build_grayscale_palette");

   if (palette == NULL)
      return;

   switch (bit_depth)
   {
      case 1:
         num_palette = 2;
         color_inc = 0xff;
         break;

      case 2:
         num_palette = 4;
         color_inc = 0x55;
         break;

      case 4:
         num_palette = 16;
         color_inc = 0x11;
         break;

      case 8:
         num_palette = 256;
         color_inc = 1;
         break;

      default:
         num_palette = 0;
         color_inc = 0;
         break;
   }

   for (i = 0, v = 0; i < num_palette; i++, v += color_inc)
   {
      palette[i].red = (png_byte)(v & 0xff);
      palette[i].green = (png_byte)(v & 0xff);
      palette[i].blue = (png_byte)(v & 0xff);
   }
}